

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QString * __thiscall
QTzTimeZonePrivate::abbreviation(QTzTimeZonePrivate *this,qint64 atMSecsSinceEpoch)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  qint64 in_stack_00000070;
  QTzTimeZonePrivate *in_stack_00000078;
  QString *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  data(in_stack_00000078,in_stack_00000070);
  QString::QString(this_00,in_RDI);
  QTimeZonePrivate::Data::~Data((Data *)0x74c563);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTzTimeZonePrivate::abbreviation(qint64 atMSecsSinceEpoch) const
{
    return data(atMSecsSinceEpoch).abbreviation;
}